

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom
          (WordEmbedding *this,WordEmbedding *from)

{
  uint32_t uVar1;
  LogMessage *other;
  ulong uVar2;
  WordEmbedding *pWVar3;
  Arena *pAVar4;
  string *psVar5;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  WordEmbedding *local_38;
  WordEmbedding *from_local;
  WordEmbedding *this_local;
  WordEmbedding *local_20;
  string *local_18;
  WordEmbedding *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/WordEmbedding.pb.cc"
               ,0x104);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  _internal_language_abi_cxx11_(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pWVar3 = (WordEmbedding *)_internal_language_abi_cxx11_(local_38);
    this_local = pWVar3;
    local_20 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,pWVar3,pAVar4);
  }
  _internal_modelparameterdata_abi_cxx11_(local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_modelparameterdata_abi_cxx11_(local_38);
    local_18 = psVar5;
    local_10 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,psVar5,pAVar4);
  }
  uVar1 = _internal_revision(local_38);
  if (uVar1 != 0) {
    uVar1 = _internal_revision(local_38);
    _internal_set_revision(this,uVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WordEmbedding::MergeFrom(const WordEmbedding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_language().empty()) {
    _internal_set_language(from._internal_language());
  }
  if (!from._internal_modelparameterdata().empty()) {
    _internal_set_modelparameterdata(from._internal_modelparameterdata());
  }
  if (from._internal_revision() != 0) {
    _internal_set_revision(from._internal_revision());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}